

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

bool __thiscall capnp::_::SegmentBuilder::tryExtend(SegmentBuilder *this,word *from,word *to)

{
  word *pwVar1;
  word *to_local;
  word *from_local;
  SegmentBuilder *this_local;
  
  if (((this->pos == from) &&
      (pwVar1 = kj::ArrayPtr<const_capnp::word>::end(&(this->super_SegmentReader).ptr), to <= pwVar1
      )) && (from <= to)) {
    this->pos = to;
    return true;
  }
  return false;
}

Assistant:

inline bool SegmentBuilder::tryExtend(word* from, word* to) {
  // Careful about overflow.
  if (pos == from && to <= ptr.end() && to >= from) {
    pos = to;
    return true;
  } else {
    return false;
  }
}